

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O1

void luaJIT_profile_start(lua_State *L,char *mode,luaJIT_profile_callback cb,void *data)

{
  char cVar1;
  int interval;
  int iVar2;
  itimerval tm;
  itimerval local_e8;
  sigaction local_c8;
  
  cVar1 = *mode;
  if (cVar1 == '\0') {
    iVar2 = 10;
  }
  else {
    iVar2 = 10;
    do {
      mode = mode + 1;
      if ((cVar1 == 'f') || (cVar1 == 'l')) {
        *(int *)((L->glref).ptr64 + 0xefc) = (int)cVar1;
        lj_trace_flushall(L);
      }
      else if (cVar1 == 'i') {
        cVar1 = *mode;
        iVar2 = 0;
        if ((byte)(cVar1 - 0x30U) < 10) {
          iVar2 = 0;
          do {
            iVar2 = (uint)(byte)(cVar1 - 0x30) + iVar2 * 10;
            cVar1 = mode[1];
            mode = mode + 1;
          } while ((byte)(cVar1 - 0x30U) < 10);
        }
        if (iVar2 < 2) {
          iVar2 = 1;
        }
      }
      cVar1 = *mode;
    } while (cVar1 != '\0');
  }
  if ((profile_state.g == (global_State *)0x0) ||
     (luaJIT_profile_stop(L), profile_state.g == (global_State *)0x0)) {
    profile_state.g = (global_State *)(L->glref).ptr64;
    profile_state.samples = 0;
    profile_state.sb.w = (char *)0x0;
    profile_state.sb.e = (char *)0x0;
    profile_state.sb.b = (char *)0x0;
    local_e8.it_interval.tv_sec = (__time_t)(iVar2 / 1000);
    local_e8.it_interval.tv_usec = (__suseconds_t)((iVar2 % 1000) * 1000);
    profile_state.cb = cb;
    profile_state.data = data;
    profile_state.sb.L.ptr64 = (uint64_t)L;
    profile_state.interval = iVar2;
    local_e8.it_value.tv_sec = local_e8.it_interval.tv_sec;
    local_e8.it_value.tv_usec = local_e8.it_interval.tv_usec;
    setitimer(ITIMER_PROF,&local_e8,(itimerval *)0x0);
    local_c8.sa_flags = 0x10000000;
    local_c8.__sigaction_handler.sa_handler = profile_signal;
    sigemptyset(&local_c8.sa_mask);
    sigaction(0x1b,&local_c8,(sigaction *)&profile_state.oldsa);
  }
  return;
}

Assistant:

LUA_API void luaJIT_profile_start(lua_State *L, const char *mode,
				  luaJIT_profile_callback cb, void *data)
{
  ProfileState *ps = &profile_state;
  int interval = LJ_PROFILE_INTERVAL_DEFAULT;
  while (*mode) {
    int m = *mode++;
    switch (m) {
    case 'i':
      interval = 0;
      while (*mode >= '0' && *mode <= '9')
	interval = interval * 10 + (*mode++ - '0');
      if (interval <= 0) interval = 1;
      break;
#if LJ_HASJIT
    case 'l': case 'f':
      L2J(L)->prof_mode = m;
      lj_trace_flushall(L);
      break;
#endif
    default:  /* Ignore unknown mode chars. */
      break;
    }
  }
  if (ps->g) {
    luaJIT_profile_stop(L);
    if (ps->g) return;  /* Profiler in use by another VM. */
  }
  ps->g = G(L);
  ps->interval = interval;
  ps->cb = cb;
  ps->data = data;
  ps->samples = 0;
  lj_buf_init(L, &ps->sb);
  profile_timer_start(ps);
}